

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

ParserOptions * __thiscall
duckdb::ClientContext::GetParserOptions(ParserOptions *__return_storage_ptr__,ClientContext *this)

{
  DatabaseInstance *pDVar1;
  
  __return_storage_ptr__->preserve_identifier_case = true;
  __return_storage_ptr__->integer_division = false;
  __return_storage_ptr__->max_expression_depth = 1000;
  __return_storage_ptr__->extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
  __return_storage_ptr__->preserve_identifier_case = (this->config).preserve_identifier_case;
  __return_storage_ptr__->integer_division = (this->config).integer_division;
  __return_storage_ptr__->max_expression_depth = (this->config).max_expression_depth;
  pDVar1 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->db);
  __return_storage_ptr__->extensions = &(pDVar1->config).parser_extensions;
  return __return_storage_ptr__;
}

Assistant:

ParserOptions ClientContext::GetParserOptions() const {
	auto &client_config = ClientConfig::GetConfig(*this);
	ParserOptions options;
	options.preserve_identifier_case = client_config.preserve_identifier_case;
	options.integer_division = client_config.integer_division;
	options.max_expression_depth = client_config.max_expression_depth;
	options.extensions = &DBConfig::GetConfig(*this).parser_extensions;
	return options;
}